

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EndCriteria.cpp
# Opt level: O2

bool __thiscall
QuantLib::EndCriteria::operator()
          (EndCriteria *this,size_t iteration,size_t *statStateIterations,bool positiveOptimization,
          RealType fold,RealType param_5,RealType fnew,RealType normgnew,Type *ecType)

{
  Type TVar1;
  bool bVar2;
  
  if (iteration < this->maxIterations_) {
    bVar2 = checkStationaryFunctionValue(this,fold,fnew,statStateIterations,ecType);
    if (bVar2) {
      return true;
    }
    if ((!positiveOptimization) || (this->functionEpsilon_ <= fnew)) {
      if (this->gradientNormEpsilon_ <= normgnew) {
        return false;
      }
      TVar1 = ZeroGradientNorm;
    }
    else {
      TVar1 = StationaryFunctionAccuracy;
    }
  }
  else {
    TVar1 = MaxIterations;
  }
  *ecType = TVar1;
  return true;
}

Assistant:

bool EndCriteria::operator()(const size_t iteration,
                               size_t& statStateIterations,
                               const bool positiveOptimization,
                               const RealType fold,
                               const RealType,  // normgold,
                               const RealType fnew, const RealType normgnew,
                               EndCriteria::Type& ecType) const {
    return checkMaxIterations(iteration, ecType) ||
           checkStationaryFunctionValue(fold, fnew, statStateIterations,
                                        ecType) ||
           checkStationaryFunctionAccuracy(fnew, positiveOptimization,
                                           ecType) ||
           checkZeroGradientNorm(normgnew, ecType);
  }